

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall cmGeneratorTarget::MacOSXRpathInstallNameDirDefault(cmGeneratorTarget *this)

{
  cmMakefile *this_00;
  bool bVar1;
  PolicyStatus PVar2;
  char *pcVar3;
  cmGlobalGenerator *this_01;
  string *target;
  allocator local_a1;
  PolicyStatus cmp0042;
  allocator local_79;
  string local_78;
  char *local_58;
  char *macosx_rpath_str;
  allocator local_39;
  string local_38;
  cmGeneratorTarget *local_18;
  cmGeneratorTarget *this_local;
  
  this_00 = this->Makefile;
  local_18 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"CMAKE_SHARED_LIBRARY_RUNTIME_C_FLAG",&local_39);
  bVar1 = cmMakefile::IsSet(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_78,"MACOSX_RPATH",&local_79);
    pcVar3 = GetProperty(this,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    local_58 = pcVar3;
    if (pcVar3 == (char *)0x0) {
      PVar2 = GetPolicyStatusCMP0042(this);
      if (PVar2 == WARN) {
        this_01 = cmLocalGenerator::GetGlobalGenerator(this->LocalGenerator);
        target = GetName_abi_cxx11_(this);
        cmGlobalGenerator::AddCMP0042WarnTarget(this_01,target);
      }
      this_local._7_1_ = PVar2 == NEW;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&cmp0042,"MACOSX_RPATH",&local_a1);
      this_local._7_1_ = GetPropertyAsBool(this,(string *)&cmp0042);
      std::__cxx11::string::~string((string *)&cmp0042);
      std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmGeneratorTarget::MacOSXRpathInstallNameDirDefault() const
{
  // we can't do rpaths when unsupported
  if (!this->Makefile->IsSet("CMAKE_SHARED_LIBRARY_RUNTIME_C_FLAG")) {
    return false;
  }

  const char* macosx_rpath_str = this->GetProperty("MACOSX_RPATH");
  if (macosx_rpath_str) {
    return this->GetPropertyAsBool("MACOSX_RPATH");
  }

  cmPolicies::PolicyStatus cmp0042 = this->GetPolicyStatusCMP0042();

  if (cmp0042 == cmPolicies::WARN) {
    this->LocalGenerator->GetGlobalGenerator()->AddCMP0042WarnTarget(
      this->GetName());
  }

  return cmp0042 == cmPolicies::NEW;
}